

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

Var Js::JavascriptSet::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  Entry **this;
  ScriptContext *pSVar1;
  JavascriptLibrary *this_00;
  ThreadContext *this_01;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var aValue;
  RecyclableObject *pRVar7;
  CallInfo iterator;
  Var pvVar8;
  RecyclableObject *nextFunc;
  JavascriptMethod p_Var9;
  int in_stack_00000010;
  Arguments local_b0;
  undefined1 local_a0 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  Var local_60;
  CallInfo local_58;
  CallInfo callInfo_local;
  JavascriptSet *local_48;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb5322;
    *puVar6 = 0;
  }
  this = &__tag.entry.next;
  ArgumentReader::ArgumentReader((ArgumentReader *)this,&local_58,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this_00 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a0,function,local_58,L"Set",&stack0x00000000);
  aValue = Arguments::GetNewTarget((Arguments *)this);
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_b0);
  if (((ulong)local_58 & 0x1000000) == 0) {
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Set");
  }
  local_48 = JavascriptLibrary::CreateSet(this_00);
  if (local_48 == (JavascriptSet *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x31,"(setObject != nullptr)","setObject != nullptr");
    if (!bVar4) goto LAB_00bb5322;
    *puVar6 = 0;
  }
  if (((uint)__tag.entry.next & 0xfffffe) == 0) {
    pRVar7 = (this_00->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&__tag.entry.next,1);
  }
  if (local_48->kind == EmptySet) {
    BVar5 = JavascriptConversion::CheckObjectCoercible(pRVar7,pSVar1);
    if (BVar5 != 0) {
      iterator = (CallInfo)JavascriptOperators::GetIterator(pRVar7,pSVar1,false);
      pvVar8 = JavascriptOperators::GetPropertyNoCache((RecyclableObject *)local_48,0x4a,pSVar1);
      bVar4 = JavascriptConversion::IsCallable(pvVar8);
      if (!bVar4) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
      }
      pRVar7 = VarTo<Js::RecyclableObject>(pvVar8);
      if (iterator != (CallInfo)0x0) {
        local_60 = (Var)0x0;
        callInfo_local = iterator;
        nextFunc = JavascriptOperators::CacheIteratorNext((RecyclableObject *)iterator,pSVar1);
        while (bVar4 = JavascriptOperators::IteratorStepAndValue
                                 ((RecyclableObject *)iterator,pSVar1,nextFunc,&local_60),
              pvVar8 = local_60, bVar4) {
          this_01 = pSVar1->threadContext;
          bVar4 = this_01->reentrancySafeOrHandled;
          this_01->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
          ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
          p_Var9 = RecyclableObject::GetEntryPoint(pRVar7);
          CheckIsExecutable(pRVar7,p_Var9);
          p_Var9 = RecyclableObject::GetEntryPoint(pRVar7);
          (*p_Var9)(pRVar7,(CallInfo)pRVar7,0x2000002,0,0,0,0,0x2000002,local_48,pvVar8);
          this_01->reentrancySafeOrHandled = bVar4;
          iterator = callInfo_local;
        }
      }
    }
    if (bVar3) {
      pRVar7 = VarTo<Js::RecyclableObject>(aValue);
      local_48 = (JavascriptSet *)
                 JavascriptOperators::OrdinaryCreateFromConstructor
                           (pRVar7,(RecyclableObject *)local_48,(DynamicObject *)0x0,pSVar1);
    }
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_a0);
    return local_48;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                              ,0x38,"((0))","UNREACHED");
  if (bVar3) {
    *puVar6 = 0;
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec06,L"Set");
  }
LAB_00bb5322:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Var JavascriptSet::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Set"));

    Var newTarget = args.GetNewTarget();
    bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Set, scriptContext);

    JavascriptSet* setObject = nullptr;

    if (callInfo.Flags & CallFlags_New)
    {
        setObject = library->CreateSet();
    }
    else
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Set"), _u("Set"));
    }
    Assert(setObject != nullptr);

    Var iterable = (args.Info.Count > 1) ? args[1] : library->GetUndefined();

    // REVIEW: This condition seems impossible?
    if (setObject->kind != SetKind::EmptySet)
    {
        Assert(UNREACHED);
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_ObjectIsAlreadyInitialized, _u("Set"), _u("Set"));
    }

    RecyclableObject* iter = nullptr;
    RecyclableObject* adder = nullptr;

    if (JavascriptConversion::CheckObjectCoercible(iterable, scriptContext))
    {
        iter = JavascriptOperators::GetIterator(iterable, scriptContext);
        Var adderVar = JavascriptOperators::GetPropertyNoCache(setObject, PropertyIds::add, scriptContext);
        if (!JavascriptConversion::IsCallable(adderVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        adder = VarTo<RecyclableObject>(adderVar);
    }

    if (iter != nullptr)
    {
        JavascriptOperators::DoIteratorStepAndValue(iter, scriptContext, [&](Var nextItem) {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(), adder, CallInfo(CallFlags_Value, 2), setObject, nextItem);
            }
            END_SAFE_REENTRANT_CALL
        });
    }

    return isCtorSuperCall ?
        JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), setObject, nullptr, scriptContext) :
        setObject;
}